

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_linear_resampler_config *
ma_linear_resampler_config_init
          (ma_linear_resampler_config *__return_storage_ptr__,ma_format format,ma_uint32 channels,
          ma_uint32 sampleRateIn,ma_uint32 sampleRateOut)

{
  ma_uint32 sampleRateOut_local;
  ma_uint32 sampleRateIn_local;
  ma_uint32 channels_local;
  ma_format format_local;
  
  memset(__return_storage_ptr__,0,0x20);
  __return_storage_ptr__->format = format;
  __return_storage_ptr__->channels = channels;
  __return_storage_ptr__->sampleRateIn = sampleRateIn;
  __return_storage_ptr__->sampleRateOut = sampleRateOut;
  __return_storage_ptr__->lpfOrder = 4;
  __return_storage_ptr__->lpfNyquistFactor = 1.0;
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_linear_resampler_config ma_linear_resampler_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRateIn, ma_uint32 sampleRateOut)
{
    ma_linear_resampler_config config;
    MA_ZERO_OBJECT(&config);
    config.format           = format;
    config.channels         = channels;
    config.sampleRateIn     = sampleRateIn;
    config.sampleRateOut    = sampleRateOut;
    config.lpfOrder         = ma_min(MA_DEFAULT_RESAMPLER_LPF_ORDER, MA_MAX_FILTER_ORDER);
    config.lpfNyquistFactor = 1;

    return config;
}